

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O0

void __thiscall
SemanticAnalyzerRun::SemanticAnalyzerRun
          (SemanticAnalyzerRun *this,ostream *out,shared_ptr<const_Readable> *reader)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  __l;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *local_480;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  local_453;
  key_equal local_452;
  hasher local_451;
  int local_450 [24];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_3f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_3c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_3a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_378;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_350;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_328;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_300;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_2d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_2b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_288;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_260;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_238;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_210;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_1e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_1c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_198;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_148;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_120;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_58;
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  shared_ptr<const_Readable> *reader_local;
  ostream *out_local;
  SemanticAnalyzerRun *this_local;
  
  local_20 = (undefined1  [8])reader;
  reader_local = (shared_ptr<const_Readable> *)out;
  out_local = (ostream *)this;
  AstWalker::AstWalker(&this->super_AstWalker);
  (this->super_AstWalker)._vptr_AstWalker = (_func_int **)&PTR__SemanticAnalyzerRun_001a3120;
  this->out = (ostream *)reader_local;
  std::shared_ptr<const_Readable>::shared_ptr(&this->reader,reader);
  local_450[0x17] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[4],_int,_true>(&local_3f0,(char (*) [4])"add",local_450 + 0x17);
  local_450[0x16] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[9],_int,_true>(&local_3c8,(char (*) [9])"subtract",local_450 + 0x16);
  local_450[0x15] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[9],_int,_true>(&local_3a0,(char (*) [9])"multiply",local_450 + 0x15);
  local_450[0x14] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[7],_int,_true>(&local_378,(char (*) [7])"divide",local_450 + 0x14);
  local_450[0x13] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[6],_int,_true>(&local_350,(char (*) [6])"equal",local_450 + 0x13);
  local_450[0x12] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[9],_int,_true>(&local_328,(char (*) [9])"notEqual",local_450 + 0x12);
  local_450[0x11] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[4],_int,_true>(&local_300,(char (*) [4])"not",local_450 + 0x11);
  local_450[0x10] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[4],_int,_true>(&local_2d8,(char (*) [4])"and",local_450 + 0x10);
  local_450[0xf] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[3],_int,_true>(&local_2b0,(char (*) [3])0x16760b,local_450 + 0xf);
  local_450[0xe] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[8],_int,_true>(&local_288,(char (*) [8])"greater",local_450 + 0xe);
  local_450[0xd] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[5],_int,_true>(&local_260,(char (*) [5])"less",local_450 + 0xd);
  local_450[0xc] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[15],_int,_true>(&local_238,(char (*) [15])"greaterOrEqual",local_450 + 0xc);
  local_450[0xb] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[12],_int,_true>(&local_210,(char (*) [12])"lessOrEqual",local_450 + 0xb);
  local_450[10] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[4],_int,_true>(&local_1e8,(char (*) [4])"get",local_450 + 10);
  local_450[9] = 3;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[4],_int,_true>(&local_1c0,(char (*) [4])"set",local_450 + 9);
  local_450[8] = 0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[5],_int,_true>(&local_198,(char (*) [5])"read",local_450 + 8);
  local_450[7] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[6],_int,_true>(&local_170,(char (*) [6])"print",local_450 + 7);
  local_450[6] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[4],_int,_true>(&local_148,(char (*) [4])"env",local_450 + 6);
  local_450[5] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[5],_int,_true>(&local_120,(char (*) [5])0x1662fc,local_450 + 5);
  local_450[4] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[4],_int,_true>(&local_f8,(char (*) [4])0x167fc3,local_450 + 4);
  local_450[3] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[6],_int,_true>(&local_d0,(char (*) [6])"float",local_450 + 3);
  local_450[2] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[7],_int,_true>(&local_a8,(char (*) [7])"length",local_450 + 2);
  local_450[1] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[7],_int,_true>(&local_80,(char (*) [7])"charAt",local_450 + 1);
  local_450[0] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  ::pair<const_char_(&)[7],_int,_true>(&local_58,(char (*) [7])"append",local_450);
  local_30 = &local_3f0;
  local_28 = 0x18;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  ::allocator(&local_453);
  __l._M_len = local_28;
  __l._M_array = local_30;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::unordered_map(&this->builtInFunctionArgumentCounts,__l,0,&local_451,&local_452,&local_453);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  ::~allocator(&local_453);
  local_480 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
               *)&local_30;
  do {
    local_480 = local_480 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::~pair(local_480);
  } while (local_480 != &local_3f0);
  this->error = false;
  this->functionDept = 0;
  this->inLoop = false;
  std::
  unordered_map<FunctionDeclarationExpressionAstNode_*,_bool,_std::hash<FunctionDeclarationExpressionAstNode_*>,_std::equal_to<FunctionDeclarationExpressionAstNode_*>,_std::allocator<std::pair<FunctionDeclarationExpressionAstNode_*const,_bool>_>_>
  ::unordered_map(&this->inLoopState);
  std::make_shared<Scope>();
  return;
}

Assistant:

explicit SemanticAnalyzerRun(std::ostream & out, std::shared_ptr<const Readable> reader) noexcept
  : out{out}
  , reader{std::move(reader)}
  , builtInFunctionArgumentCounts{{
    {"add", 2},
    {"subtract", 2},
    {"multiply", 2},
    {"divide", 2},
    {"equal", 2},
    {"notEqual", 2},
    {"not", 1},
    {"and", 2},
    {"or", 2},
    {"greater", 2},
    {"less", 2},
    {"greaterOrEqual", 2},
    {"lessOrEqual", 2},
    {"get", 2},
    {"set", 3},
    {"read", 0},
    {"print", 1},
    {"env", 1},
    {"type", 1},
    {"int", 1},
    {"float", 1},
    {"length", 1},
    {"charAt", 2},
    {"append", 2}
  }}
  , error{false}
  , functionDept{0}
  , inLoop{false}
  , currentScope{std::make_shared<Scope>()}
  {}